

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket-rpc.c++
# Opt level: O1

Promise<void> __thiscall capnp::WebSocketMessageStream::end(WebSocketMessageStream *this)

{
  long in_RSI;
  
  (**(code **)(**(long **)(in_RSI + 8) + 0x10))
            (this,*(long **)(in_RSI + 8),0x3ed,"Capnp connection closed",0x18);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> WebSocketMessageStream::end() {
  return socket.close(
    1005, // most generic code, indicates "No Status Received."
          // Since the MessageStream API doesn't tell us why
          // we're closing the connection, this is the best
          // we can do. This is consistent with what browser
          // implementations do if no status is provided, see:
          //
          // * https://developer.mozilla.org/en-US/docs/Web/API/WebSocket/close
          // * https://developer.mozilla.org/en-US/docs/Web/API/CloseEvent

    "Capnp connection closed" // Similarly not much information to go on here,
                              // but this at least lets us trace this back to
                              // capnp.
  );
}